

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_filter.cpp
# Opt level: O2

uint64_t * read_data(char *filename,size_t *array_size,size_t maxline,bool printall)

{
  ulong uVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t *puVar6;
  FILE *__stream;
  ulong uVar7;
  clock_t cVar8;
  __off_t _Var9;
  undefined7 in_register_00000009;
  char *line;
  size_t line_capacity;
  uint8_t *local_80;
  uint local_74;
  uint64_t *local_70;
  ulong *local_68;
  uint32_t local_5c;
  undefined4 local_58;
  uint32_t local_54;
  ulong local_50;
  size_t local_48;
  clock_t local_40;
  size_t local_38;
  
  local_80 = (uint8_t *)0x0;
  local_38 = 0;
  puVar6 = (uint64_t *)malloc(0x12c000000);
  if (puVar6 == (uint64_t *)0x0) {
    puVar6 = (uint64_t *)0x0;
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
  }
  else {
    *array_size = 0;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("Cannot read the input file %s.",filename);
      free(puVar6);
LAB_001015cf:
      puVar6 = (uint64_t *)0x0;
    }
    else {
      local_58 = (undefined4)CONCAT71(in_register_00000009,printall);
      local_48 = 0x25800000;
      local_70 = puVar6;
      local_68 = array_size;
      local_50 = maxline;
      local_40 = clock();
      while( true ) {
        uVar7 = getline((char **)&local_80,&local_38,__stream);
        puVar2 = local_80;
        if ((int)uVar7 == -1) break;
        if ((int)uVar7 < 0x10) {
          printf("\r%256s","");
          fflush((FILE *)0x0);
          printf("Skipping line %s since it is too short (%d)\n",local_80,uVar7 & 0xffffffff);
        }
        else {
          local_54 = hex_to_u32_nocheck(local_80);
          uVar4 = hex_to_u32_nocheck(puVar2 + 4);
          local_74 = hex_to_u32_nocheck(puVar2 + 8);
          uVar3 = local_54;
          uVar5 = hex_to_u32_nocheck(puVar2 + 0xc);
          if ((local_74 | uVar5 | uVar4 | uVar3) < 0x10000) {
            if (local_48 <= *local_68) {
              local_48 = (*local_68 * 3 >> 1) + 0x40;
              local_5c = uVar5;
              local_70 = (uint64_t *)realloc(local_70,local_48);
              uVar5 = local_5c;
              if (local_70 == (uint64_t *)0x0) {
                puts("Reallocation failed. Aborting.");
                goto LAB_001015cf;
              }
            }
            uVar7 = (ulong)local_74 << 0x10 | (ulong)uVar5 |
                    (ulong)uVar4 << 0x20 | (ulong)uVar3 << 0x30;
            if ((char)local_58 != '\0') {
              printf("hexval = 0x%lx\n",uVar7);
            }
            uVar1 = *local_68;
            *local_68 = uVar1 + 1;
            local_70[uVar1] = uVar7;
            uVar7 = *local_68;
            if ((uVar7 != 0) && (uVar7 % 1000000 == 0)) {
              printf("\rread %zu hashes.");
              uVar7 = *local_68;
            }
            if (uVar7 == local_50) {
              printf("Reached the maximum number of lines %zu.\n",local_50);
              break;
            }
            fflush((FILE *)0x0);
          }
          else {
            printf("\r%256s","");
            fflush((FILE *)0x0);
            printf("Skipping line %s since it does not start with an hexadecimal\n",local_80);
          }
        }
      }
      cVar8 = clock();
      free(local_80);
      _Var9 = ftello(__stream);
      fclose(__stream);
      printf("\rI read %zu hashes in total (%.3f seconds).\n",
             (double)((float)(cVar8 - local_40) / 1e+06),*local_68);
      printf("Bytes read = %zu.\n",_Var9);
      puVar6 = local_70;
    }
  }
  return puVar6;
}

Assistant:

uint64_t *read_data(const char *filename, size_t &array_size, size_t maxline,
                    bool printall) {
  char *line = NULL;
  size_t line_capacity = 0;
  int read;

  size_t array_capacity = 600 * 1024 * 1024;
  uint64_t *array = (uint64_t *)malloc(array_capacity * sizeof(uint64_t));
  if (array == NULL) {
    printf("Cannot allocate memory. Use a machine with plenty of RAM.");
    return nullptr;
  }
  array_size = 0;

  FILE *fp = fopen(filename, "r");
  if (fp == NULL) {
    printf("Cannot read the input file %s.", filename);
    free(array);
    return nullptr;
  }
  clock_t start = clock();

  while ((read = getline(&line, &line_capacity, fp)) != -1) {
    if (read < 16) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it is too short (%d)\n", line, read);
      continue;
    }
    uint64_t x1 = hex_to_u32_nocheck((const uint8_t *)line);
    uint64_t x2 = hex_to_u32_nocheck((const uint8_t *)line + 4);
    uint64_t x3 = hex_to_u32_nocheck((const uint8_t *)line + 8);
    uint64_t x4 = hex_to_u32_nocheck((const uint8_t *)line + 12);
    if ((x1 | x2 | x3 | x4) > 0xFFFF) {
      printf("\r%256s", "");
      fflush(NULL);
      printf("Skipping line %s since it does not start with an hexadecimal\n",
             line);
      continue;
    }
    if (array_size >= array_capacity) {
      array_capacity = 3 * array_size / 2 + 64;
      uint64_t *newarray = (uint64_t *)realloc(array, array_capacity);
      if (newarray == NULL) {
        printf("Reallocation failed. Aborting.\n");
        return nullptr;
      }
      array = newarray;
    }
    uint64_t hexval = (x1 << 48) | (x2 << 32) | (x3 << 16) | x4;
    if (printall)
      printf("hexval = 0x%" PRIx64 "\n", hexval);
    array[array_size++] = hexval;
    if ((array_size > 0) && ((array_size % 1000000) == 0)) {
      printf("\rread %zu hashes.", array_size);
    }
    if (array_size == maxline) {
      printf("Reached the maximum number of lines %zu.\n", maxline);
      break;
    }
    fflush(NULL);
  }
  clock_t end = clock();
  free(line);
  size_t numberofbytes = ftello(fp);
  fclose(fp);

  printf("\rI read %zu hashes in total (%.3f seconds).\n", array_size,
         (float)(end - start) / CLOCKS_PER_SEC);
  printf("Bytes read = %zu.\n", numberofbytes);
  return array;
}